

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManDumpDsd(If_DsdMan_t *p,int Support)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Vec_Mem_t *pVVar5;
  word *pwVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  FILE *__s;
  void *__s_00;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong *puVar19;
  uint local_68;
  
  __s = fopen("tts_nondsd.txt","wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_nondsd.txt");
    return;
  }
  if (2 < p->nVars) {
    uVar10 = 6;
    if (6 < (uint)Support) {
      uVar10 = Support;
    }
    lVar14 = 3;
    do {
      iVar1 = p->vTtMem[lVar14]->nEntries;
      iVar11 = iVar1;
      if (iVar1 - 1U < 0xf) {
        iVar11 = 0x10;
      }
      if ((iVar11 == 0) || (__s_00 = malloc((long)iVar11 << 2), __s_00 == (void *)0x0)) {
        __s_00 = (void *)0x0;
      }
      else {
        memset(__s_00,0,(long)iVar1 * 4);
      }
      iVar11 = (p->vObjs).nSize;
      if (0 < iVar11) {
        local_68 = (uint)lVar14;
        uVar2 = uVar10;
        if (Support == 0) {
          uVar2 = local_68;
        }
        iVar8 = 1 << ((char)uVar2 - 6U & 0x1f);
        if (uVar2 < 7) {
          iVar8 = 1;
        }
        uVar9 = ~(-1 << ((char)uVar2 - 2U & 0x1f));
        if (5 < (int)uVar2) {
          uVar9 = 0xf;
        }
        lVar18 = 0;
        do {
          piVar4 = (int *)(p->vObjs).pArray[lVar18];
          uVar2 = piVar4[1];
          if (((Support == 0) || ((uVar2 >> 3 & 0x1f) == Support)) && ((uVar2 & 7) == 6)) {
            if (uVar2 < 0x18000000) {
LAB_0041fe7e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar15 = *piVar4;
            if (((long)iVar15 < 0) || ((p->vTruths).nSize <= iVar15)) goto LAB_0041fe7e;
            iVar15 = (p->vTruths).pArray[iVar15];
            lVar13 = (long)iVar15;
            if ((lVar13 < 0) || (iVar1 <= iVar15)) goto LAB_0041fe7e;
            if (*(int *)((long)__s_00 + lVar13 * 4) == 0) {
              *(undefined4 *)((long)__s_00 + lVar13 * 4) = 1;
              fwrite("0x",2,1,__s);
              uVar2 = piVar4[1];
              if ((uVar2 < 0x18000000) || ((uVar2 & 7) != 6)) {
LAB_0041fe9d:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              iVar11 = *piVar4;
              if (((long)iVar11 < 0) || ((p->vTruths).nSize <= iVar11)) goto LAB_0041fe7e;
              uVar3 = (p->vTruths).pArray[iVar11];
              if (((int)uVar3 < 0) ||
                 (pVVar5 = p->vTtMem[uVar2 >> 0x1b], pVVar5->nEntries <= (int)uVar3))
              goto LAB_0041fe9d;
              iVar11 = pVVar5->nEntrySize;
              uVar2 = pVVar5->PageMask;
              pwVar6 = pVVar5->ppPages[uVar3 >> ((byte)pVVar5->LogPageSze & 0x1f)];
              puVar19 = pwVar6 + (long)(int)(uVar2 & uVar3) * (long)iVar11 + iVar8;
              while (puVar19 = puVar19 + -1, lVar13 = (ulong)uVar9 << 2, lVar16 = (ulong)uVar9 + 1,
                    pwVar6 + (long)(int)(uVar2 & uVar3) * (long)iVar11 <= puVar19) {
                do {
                  uVar12 = (uint)(*puVar19 >> ((byte)lVar13 & 0x3c)) & 0xf;
                  iVar15 = uVar12 + 0x30;
                  if (9 < uVar12) {
                    iVar15 = uVar12 + 0x37;
                  }
                  fputc(iVar15,__s);
                  lVar17 = lVar16 + -1;
                  bVar7 = 0 < lVar16;
                  lVar13 = lVar13 + -4;
                  lVar16 = lVar17;
                } while (lVar17 != 0 && bVar7);
              }
              fputc(10,__s);
              iVar11 = (p->vObjs).nSize;
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar11);
      }
      if (__s_00 != (void *)0x0) {
        free(__s_00);
      }
      bVar7 = lVar14 < p->nVars;
      lVar14 = lVar14 + 1;
    } while (bVar7);
  }
  fclose(__s);
  return;
}

Assistant:

void If_DsdManDumpDsd( If_DsdMan_t * p, int Support )
{
    char * pFileName = "tts_nondsd.txt";
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    FILE * pFile = fopen( pFileName, "wb" );
    int v, i;
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        vMap = Vec_IntStart( Vec_MemEntryNum(p->vTtMem[v]) );
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
        {
            if ( Support && Support != If_DsdObjSuppSize(pObj) )
                continue;
            if ( If_DsdObjType(pObj) != IF_DSD_PRIME )
                continue;
            if ( Vec_IntEntry(vMap, If_DsdObjTruthId(p, pObj)) )
                continue;
            Vec_IntWriteEntry(vMap, If_DsdObjTruthId(p, pObj), 1);
            fprintf( pFile, "0x" );
            Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), Support ? Abc_MaxInt(Support, 6) : v );
            fprintf( pFile, "\n" );
            //printf( "    " );
            //Dau_DsdPrintFromTruth( If_DsdObjTruth(p, pObj), p->nVars );
        }
        Vec_IntFree( vMap );
    }
    fclose( pFile );
}